

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsBinarySemaphore.h
# Opt level: O0

void __thiscall HighsBinarySemaphore::acquire(HighsBinarySemaphore *this)

{
  int iVar1;
  bool bVar2;
  HighsBinarySemaphore *this_00;
  pointer pDVar3;
  int prev;
  unique_lock<std::mutex> lg;
  rep_conflict numMicroSecs;
  int i;
  int spinIters;
  time_point tStart;
  memory_order __b_3;
  memory_order __b_1;
  memory_order __b_2;
  memory_order __b;
  mutex_type *in_stack_fffffffffffffed8;
  pointer in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  duration<long,_std::ratio<1L,_1000000L>_> local_a0;
  rep_conflict local_98;
  int local_90;
  int local_8c;
  HighsBinarySemaphore *in_stack_ffffffffffffff78;
  
  bVar2 = try_acquire(in_stack_ffffffffffffff78);
  if (!bVar2) {
    this_00 = (HighsBinarySemaphore *)std::chrono::_V2::system_clock::now();
    local_8c = 10;
    while( true ) {
      for (local_90 = 0; local_90 < local_8c; local_90 = local_90 + 1) {
        pDVar3 = std::
                 unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                 ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                               *)0x4bc2ed);
        std::operator&(memory_order_relaxed,__memory_order_mask);
        if (((pDVar3->count).super___atomic_base<int>._M_i == 1) &&
           (bVar2 = try_acquire(this_00), bVar2)) {
          return;
        }
        HighsSpinMutex::yieldProcessor();
      }
      std::chrono::_V2::system_clock::now();
      std::chrono::operator-
                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffee0);
      local_a0.__r = (rep_conflict)
                     std::chrono::
                     duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                               ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                in_stack_fffffffffffffed8);
      local_98 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_a0);
      if (4999 < local_98) break;
      local_8c = local_8c << 1;
    }
    std::
    unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
    ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                  *)0x4bc42d);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    pDVar3 = std::
             unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
             ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                           *)0x4bc448);
    LOCK();
    iVar1 = (pDVar3->count).super___atomic_base<int>._M_i;
    (pDVar3->count).super___atomic_base<int>._M_i = -1;
    UNLOCK();
    if (iVar1 == 1) {
      pDVar3 = std::
               unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
               ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                             *)0x4bc53c);
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (pDVar3->count).super___atomic_base<int>._M_i = 0;
    }
    else {
      do {
        pDVar3 = std::
                 unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                 ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                               *)0x4bc5f1);
        std::condition_variable::wait((unique_lock *)&pDVar3->condvar);
        pDVar3 = std::
                 unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                 ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                               *)0x4bc60c);
        std::operator&(memory_order_relaxed,__memory_order_mask);
      } while ((pDVar3->count).super___atomic_base<int>._M_i != 1);
      in_stack_fffffffffffffee0 =
           std::
           unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
           ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                         *)0x4bc6a9);
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (in_stack_fffffffffffffee0->count).super___atomic_base<int>._M_i = 0;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffee0)
    ;
  }
  return;
}

Assistant:

void acquire() {
    if (try_acquire()) return;

    auto tStart = std::chrono::high_resolution_clock::now();
    int spinIters = 10;
    while (true) {
      for (int i = 0; i < spinIters; ++i) {
        if (data_->count.load(std::memory_order_relaxed) == 1) {
          if (try_acquire()) return;
        }
        HighsSpinMutex::yieldProcessor();
      }

      auto numMicroSecs =
          std::chrono::duration_cast<std::chrono::microseconds>(
              std::chrono::high_resolution_clock::now() - tStart)
              .count();

      if (numMicroSecs < HighsSchedulerConstants::kMicroSecsBeforeSleep)
        spinIters *= 2;
      else
        break;
    }

    std::unique_lock<std::mutex> lg{data_->mutex};
    int prev = data_->count.exchange(-1, std::memory_order_relaxed);
    if (prev == 1) {
      data_->count.store(0, std::memory_order_relaxed);
      return;
    }

    do {
      data_->condvar.wait(lg);
    } while (data_->count.load(std::memory_order_relaxed) != 1);

    data_->count.store(0, std::memory_order_relaxed);
  }